

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

QStringList * QCoreApplication::arguments(void)

{
  uint uVar1;
  _Head_base<0UL,_QCoreApplicationPrivate_*,_false> _Var2;
  uint *puVar3;
  QList<QString> *in_RDI;
  ulong uVar4;
  char **data;
  long in_FS_OFFSET;
  bool bVar5;
  QByteArrayView ba;
  QByteArrayView local_58;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = 0;
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QString *)0x0;
  if (self != (QCoreApplication *)0x0) {
    _Var2._M_head_impl =
         (self->d_ptr)._M_t.
         super___uniq_ptr_impl<QCoreApplicationPrivate,_std::default_delete<QCoreApplicationPrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QCoreApplicationPrivate_*,_std::default_delete<QCoreApplicationPrivate>_>
         .super__Head_base<0UL,_QCoreApplicationPrivate_*,_false>._M_head_impl;
    puVar3 = (uint *)(_Var2._M_head_impl)->argc;
    data = (_Var2._M_head_impl)->argv;
    uVar1 = *puVar3;
    QList<QString>::reserve(in_RDI,(long)(int)uVar1);
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      QByteArrayView::QByteArrayView<char_*,_true>(&local_58,data);
      ba.m_data = (storage_type *)puVar3;
      ba.m_size = (qsizetype)local_58.m_data;
      QString::fromLocal8Bit((QString *)&local_48,(QString *)local_58.m_size,ba);
      QList<QString>::emplaceBack<QString>(in_RDI,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      data = data + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCoreApplication::arguments()
{
    QStringList list;

    if (!self) {
        qWarning("QCoreApplication::arguments: Please instantiate the QApplication object first");
        return list;
    }

    const QCoreApplicationPrivate *d = self->d_func();

    const int argc = d->argc;
    char ** const argv = d->argv;
    list.reserve(argc);

#if defined(Q_OS_WIN)
    const bool argsModifiedByUser = d->origArgv == nullptr;
    if (!argsModifiedByUser) {
        QStringList commandLineArguments = winCmdArgs();

        // Even if the user didn't modify argv before passing them
        // on to QCoreApplication, derived QApplications might have.
        // If that's the case argc will differ from origArgc.
        if (argc != d->origArgc) {
            // Note: On MingGW the arguments from GetCommandLine are
            // not wildcard expanded (if wildcard expansion is enabled),
            // as opposed to the arguments in argv. This means we can't
            // compare commandLineArguments to argv/origArgc, but
            // must remove elements by value, based on whether they
            // were filtered out from argc.
            for (int i = 0; i < d->origArgc; ++i) {
                if (!contains(argc, argv, d->origArgv[i]))
                    commandLineArguments.removeAll(QString::fromLocal8Bit(d->origArgv[i]));
            }
        }

        return commandLineArguments;
    } // Fall back to rebuilding from argv/argc when a modified argv was passed.
#endif // defined(Q_OS_WIN)

    for (int a = 0; a < argc; ++a)
        list << QString::fromLocal8Bit(argv[a]);

    return list;
}